

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_attachments(HL1MDLLoader *this)

{
  undefined1 auVar1 [16];
  aiNode *paVar2;
  ulong uVar3;
  aiNode **ppaVar4;
  aiMetadata *paVar5;
  reference pvVar6;
  allocator<char> local_b9;
  string local_b8;
  aiVector3t<float> local_98;
  allocator<char> local_89;
  string local_88;
  aiNode *local_68;
  aiNode *attachment_node;
  undefined1 local_55;
  int i;
  allocator<char> local_41;
  string local_40;
  aiNode *local_20;
  aiNode *attachments_node;
  Attachment_HL1 *pattach;
  HL1MDLLoader *this_local;
  
  if (this->header_->numattachments != 0) {
    attachments_node =
         (aiNode *)
         ((this->header_->super_HalfLifeMDLBaseHeader).ident + this->header_->attachmentindex);
    pattach = (Attachment_HL1 *)this;
    paVar2 = (aiNode *)operator_new(0x478);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"<MDL_attachments>",&local_41);
    aiNode::aiNode(paVar2,&local_40);
    local_55 = 0;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    local_20 = paVar2;
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(&this->rootnode_children_,&local_20)
    ;
    local_20->mNumChildren = this->header_->numattachments;
    auVar1 = ZEXT416(local_20->mNumChildren) * ZEXT816(8);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppaVar4 = (aiNode **)operator_new__(uVar3);
    local_20->mChildren = ppaVar4;
    for (attachment_node._4_4_ = 0; attachment_node._4_4_ < this->header_->numattachments;
        attachment_node._4_4_ = attachment_node._4_4_ + 1) {
      paVar2 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar2);
      local_20->mChildren[attachment_node._4_4_] = paVar2;
      paVar2->mParent = local_20;
      local_68 = paVar2;
      paVar5 = aiMetadata::Alloc(2);
      local_68->mMetaData = paVar5;
      paVar5 = local_68->mMetaData;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Position",&local_89);
      aiVector3t<float>::aiVector3t
                (&local_98,*(float *)((attachments_node->mName).data + 0x24),
                 *(float *)((attachments_node->mName).data + 0x28),
                 *(float *)((attachments_node->mName).data + 0x2c));
      aiMetadata::Set<aiVector3t<float>>(paVar5,0,&local_88,&local_98);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      paVar5 = local_68->mMetaData;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Bone",&local_b9);
      pvVar6 = std::
               vector<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
               ::operator[](&this->temp_bones_,(long)*(int *)((attachments_node->mName).data + 0x20)
                           );
      aiMetadata::Set<aiString>(paVar5,1,&local_b8,&pvVar6->node->mName);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      attachments_node = (aiNode *)((attachments_node->mName).data + 0x54);
    }
  }
  return;
}

Assistant:

void HL1MDLLoader::read_attachments() {
    if (!header_->numattachments)
        return;

    const Attachment_HL1 *pattach = (const Attachment_HL1 *)((uint8_t *)header_ + header_->attachmentindex);

    aiNode *attachments_node = new aiNode(AI_MDL_HL1_NODE_ATTACHMENTS);
    rootnode_children_.push_back(attachments_node);
    attachments_node->mNumChildren = static_cast<unsigned int>(header_->numattachments);
    attachments_node->mChildren = new aiNode *[attachments_node->mNumChildren];

    for (int i = 0; i < header_->numattachments; ++i, ++pattach) {
        aiNode *attachment_node = attachments_node->mChildren[i] = new aiNode();
        attachment_node->mParent = attachments_node;
        attachment_node->mMetaData = aiMetadata::Alloc(2);
        attachment_node->mMetaData->Set(0, "Position", aiVector3D(pattach->org[0], pattach->org[1], pattach->org[2]));
        // Reference the bone by name. This allows us to search a particular
        // bone by name using aiNode(s).
        attachment_node->mMetaData->Set(1, "Bone", temp_bones_[pattach->bone].node->mName);
    }
}